

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blob.c
# Opt level: O2

BLOB_RESULT
Blob_PutBlock(HTTPAPIEX_HANDLE httpApiExHandle,char *relativePath,uint blockID,
             BUFFER_HANDLE blockData,SINGLYLINKEDLIST_HANDLE blockIDList,uint *httpStatus,
             BUFFER_HANDLE httpResponse)

{
  undefined4 in_EAX;
  int iVar1;
  HTTPAPIEX_RESULT HVar2;
  LOGGER_LOG p_Var3;
  STRING_HANDLE handle;
  LIST_ITEM_HANDLE pLVar4;
  STRING_HANDLE handle_00;
  char *pcVar5;
  BLOB_RESULT BVar6;
  undefined1 auVar7 [16];
  uint httpResponseStatusCode;
  LIST_ITEM_HANDLE local_50;
  char blockIdString [7];
  
  auVar7._0_4_ = -(uint)(httpApiExHandle == (HTTPAPIEX_HANDLE)0x0);
  auVar7._4_4_ = -(uint)(relativePath == (char *)0x0);
  auVar7._8_4_ = -(uint)(blockData == (BUFFER_HANDLE)0x0);
  auVar7._12_4_ = -(uint)(blockIDList == (SINGLYLINKEDLIST_HANDLE)0x0);
  iVar1 = movmskps(in_EAX,auVar7);
  if (iVar1 == 0) {
    if (blockID < 50000) {
      iVar1 = sprintf(blockIdString,"%6u");
      if (iVar1 == 6) {
        handle = Azure_Base64_Encode_Bytes((uchar *)blockIdString,6);
        if (handle == (STRING_HANDLE)0x0) {
          p_Var3 = xlogging_get_log_function();
          if (p_Var3 != (LOGGER_LOG)0x0) {
            pcVar5 = "unable to Azure_Base64_Encode_Bytes";
            iVar1 = 0xad;
            goto LAB_0012ab6a;
          }
        }
        else {
          pLVar4 = singlylinkedlist_add(blockIDList,handle);
          if (pLVar4 == (LIST_ITEM_HANDLE)0x0) {
            p_Var3 = xlogging_get_log_function();
            if (p_Var3 != (LOGGER_LOG)0x0) {
              (*p_Var3)(AZ_LOG_ERROR,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/blob.c"
                        ,"Blob_PutBlock",0xb7,1,"unable to store block ID");
            }
          }
          else {
            local_50 = pLVar4;
            handle_00 = STRING_construct(relativePath);
            if (handle_00 != (STRING_HANDLE)0x0) {
              iVar1 = STRING_concat(handle_00,"&comp=block&blockid=");
              if ((iVar1 == 0) && (iVar1 = STRING_concat_with_STRING(handle_00,handle), iVar1 == 0))
              {
                httpResponseStatusCode = 0;
                pcVar5 = STRING_c_str(handle_00);
                HVar2 = HTTPAPIEX_ExecuteRequest
                                  (httpApiExHandle,HTTPAPI_REQUEST_PUT,pcVar5,
                                   (HTTP_HEADERS_HANDLE)0x0,blockData,&httpResponseStatusCode,
                                   (HTTP_HEADERS_HANDLE)0x0,httpResponse);
                if ((HVar2 != HTTPAPIEX_OK) || (BVar6 = BLOB_OK, 199 < httpResponseStatusCode - 100)
                   ) {
                  p_Var3 = xlogging_get_log_function();
                  if (p_Var3 != (LOGGER_LOG)0x0) {
                    (*p_Var3)(AZ_LOG_ERROR,
                              "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/blob.c"
                              ,"Blob_PutBlock",0xe1,1,
                              "unable to HTTPAPIEX_ExecuteRequest (HTTP response status %u)",
                              (ulong)httpResponseStatusCode);
                  }
                  singlylinkedlist_remove(blockIDList,local_50);
                  STRING_delete(handle);
                  BVar6 = BLOB_HTTP_ERROR;
                }
                if (httpStatus != (uint *)0x0) {
                  *httpStatus = httpResponseStatusCode;
                }
              }
              else {
                p_Var3 = xlogging_get_log_function();
                if (p_Var3 != (LOGGER_LOG)0x0) {
                  (*p_Var3)(AZ_LOG_ERROR,
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/blob.c"
                            ,"Blob_PutBlock",0xcd,1,"unable to STRING concatenate");
                }
                singlylinkedlist_remove(blockIDList,local_50);
                STRING_delete(handle);
                BVar6 = BLOB_ERROR;
              }
              STRING_delete(handle_00);
              return BVar6;
            }
            p_Var3 = xlogging_get_log_function();
            if (p_Var3 != (LOGGER_LOG)0x0) {
              (*p_Var3)(AZ_LOG_ERROR,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/blob.c"
                        ,"Blob_PutBlock",0xc1,1,"unable to STRING_construct");
            }
            singlylinkedlist_remove(blockIDList,local_50);
          }
          STRING_delete(handle);
        }
      }
      else {
        p_Var3 = xlogging_get_log_function();
        if (p_Var3 != (LOGGER_LOG)0x0) {
          pcVar5 = "failed to sprintf";
          iVar1 = 0xa4;
          goto LAB_0012ab6a;
        }
      }
    }
    else {
      p_Var3 = xlogging_get_log_function();
      if (p_Var3 != (LOGGER_LOG)0x0) {
        pcVar5 = "block ID too large";
        iVar1 = 0x9c;
LAB_0012ab6a:
        (*p_Var3)(AZ_LOG_ERROR,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/blob.c"
                  ,"Blob_PutBlock",iVar1,1,pcVar5);
        return BLOB_ERROR;
      }
    }
  }
  else {
    p_Var3 = xlogging_get_log_function();
    if (p_Var3 != (LOGGER_LOG)0x0) {
      (*p_Var3)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/blob.c"
                ,"Blob_PutBlock",0x97,1,
                "invalid argument detected blockData=%p blockIDList=%p relativePath=%p httpApiExHandle=%p"
                ,blockData,blockIDList,relativePath,httpApiExHandle);
      return BLOB_ERROR;
    }
  }
  return BLOB_ERROR;
}

Assistant:

BLOB_RESULT Blob_PutBlock(
        HTTPAPIEX_HANDLE httpApiExHandle,
        const char* relativePath,
        unsigned int blockID,
        BUFFER_HANDLE blockData,
        SINGLYLINKEDLIST_HANDLE blockIDList,
        unsigned int* httpStatus,
        BUFFER_HANDLE httpResponse)
{
    BLOB_RESULT result;

    if (httpApiExHandle == NULL ||
        relativePath == NULL ||
        blockData == NULL ||
        blockIDList == NULL)
    {
        LogError("invalid argument detected blockData=%p blockIDList=%p relativePath=%p httpApiExHandle=%p", blockData, blockIDList, relativePath, httpApiExHandle);
        result = BLOB_ERROR;
    }
    else if (blockID > 49999) /*outside the expected range of 000000... 049999*/
    {
        LogError("block ID too large");
        result = BLOB_ERROR;
    }
    else
    {   
        char blockIdString[AZURE_BLOB_BLOCK_ID_SIZE]; /*this will contain 000000... 049999*/
        if (sprintf(blockIdString, "%6u", (unsigned int)blockID) != AZURE_BLOB_BLOCK_ID_LENGTH) /*produces 000000... 049999*/
        {
            LogError("failed to sprintf");
            result = BLOB_ERROR;
        }
        else
        {
            STRING_HANDLE blockIdEncodedString = Azure_Base64_Encode_Bytes((const unsigned char*)blockIdString, AZURE_BLOB_BLOCK_ID_LENGTH);

            if (blockIdEncodedString == NULL)
            {
                LogError("unable to Azure_Base64_Encode_Bytes");
                result = BLOB_ERROR;
            }
            else
            {
                LIST_ITEM_HANDLE newListItem = singlylinkedlist_add(blockIDList, blockIdEncodedString);

                /*add the blockId base64 encoded to the XML*/
                if (newListItem == NULL)
                {
                    LogError("unable to store block ID");
                    STRING_delete(blockIdEncodedString);
                    result = BLOB_ERROR;
                }
                else
                {
                    STRING_HANDLE newRelativePath = STRING_construct(relativePath);

                    if (newRelativePath == NULL)
                    {
                        LogError("unable to STRING_construct");
                        (void)singlylinkedlist_remove(blockIDList, newListItem);
                        STRING_delete(blockIdEncodedString);
                        result = BLOB_ERROR;
                    }
                    else
                    {
                        if (!(
                            (STRING_concat(newRelativePath, "&comp=block&blockid=") == 0) &&
                            (STRING_concat_with_STRING(newRelativePath, blockIdEncodedString) == 0)
                            ))
                        {
                            LogError("unable to STRING concatenate");
                            (void)singlylinkedlist_remove(blockIDList, newListItem);
                            STRING_delete(blockIdEncodedString);
                            result = BLOB_ERROR;
                        }
                        else
                        {
                            unsigned int httpResponseStatusCode = 0;

                            if (HTTPAPIEX_ExecuteRequest(
                                    httpApiExHandle,
                                    HTTPAPI_REQUEST_PUT,
                                    STRING_c_str(newRelativePath),
                                    NULL,
                                    blockData,
                                    &httpResponseStatusCode,
                                    NULL,
                                    httpResponse) != HTTPAPIEX_OK ||
                                    !IS_HTTP_STATUS_CODE_SUCCESS(httpResponseStatusCode))
                            {
                                LogError("unable to HTTPAPIEX_ExecuteRequest (HTTP response status %u)", httpResponseStatusCode);
                                (void)singlylinkedlist_remove(blockIDList, newListItem);
                                STRING_delete(blockIdEncodedString);
                                result = BLOB_HTTP_ERROR;
                            }
                            else
                            {
                                result = BLOB_OK;
                            }

                            if (httpStatus != NULL)
                            {
                                *httpStatus = httpResponseStatusCode;
                            }
                        }

                        STRING_delete(newRelativePath);
                    }
                }
            }
        }
    }
    return result;
}